

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O3

TSTNode<unsigned_int> * __thiscall
BurstSimple<unsigned_int>::operator()
          (BurstSimple<unsigned_int> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,uint *oracle,
          size_t param_3)

{
  uchar **__args;
  bool bVar1;
  uint uVar2;
  TSTNode<unsigned_int> *pTVar3;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar4;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar5;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar6;
  pointer ppuVar7;
  ostream *poVar8;
  ulong uVar9;
  iterator __position;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *this_00;
  ulong uVar10;
  
  pTVar3 = (TSTNode<unsigned_int> *)operator_new(0x28);
  (pTVar3->buckets)._M_elems[0] = (void *)0x0;
  (pTVar3->buckets)._M_elems[1] = (void *)0x0;
  (pTVar3->buckets)._M_elems[2] = (void *)0x0;
  (pTVar3->is_tst).super__Base_bitset<1UL>._M_w = 0;
  pvVar4 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
  *(undefined8 *)pvVar4 = 0;
  *(undefined8 *)(pvVar4 + 8) = 0;
  *(undefined8 *)(pvVar4 + 0x10) = 0;
  pvVar5 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
  *(undefined8 *)pvVar5 = 0;
  *(undefined8 *)(pvVar5 + 8) = 0;
  *(undefined8 *)(pvVar5 + 0x10) = 0;
  pvVar6 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
  *(undefined8 *)pvVar6 = 0;
  *(undefined8 *)(pvVar6 + 8) = 0;
  *(undefined8 *)(pvVar6 + 0x10) = 0;
  uVar2 = pseudo_median<unsigned_int>
                    (oracle,(uint *)(((long)(bucket->
                                            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(bucket->
                                            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start >> 1) +
                                    (long)oracle));
  ppuVar7 = (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppuVar7) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      __args = ppuVar7 + uVar9;
      if (oracle[uVar9] < uVar2) {
        __position._M_current = *(uchar ***)(pvVar4 + 8);
        this_00 = pvVar4;
        if (__position._M_current == *(uchar ***)(pvVar4 + 0x10)) goto LAB_00217f0e;
        *__position._M_current = *__args;
        *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 8;
      }
      else if (oracle[uVar9] == uVar2) {
        __position._M_current = *(uchar ***)(pvVar5 + 8);
        this_00 = pvVar5;
        if (__position._M_current == *(uchar ***)(pvVar5 + 0x10)) {
LAB_00217f0e:
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>(this_00,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          *(long *)(pvVar5 + 8) = *(long *)(pvVar5 + 8) + 8;
        }
      }
      else {
        __position._M_current = *(uchar ***)(pvVar6 + 8);
        this_00 = pvVar6;
        if (__position._M_current == *(uchar ***)(pvVar6 + 0x10)) goto LAB_00217f0e;
        *__position._M_current = *__args;
        *(long *)(pvVar6 + 8) = *(long *)(pvVar6 + 8) + 8;
      }
      ppuVar7 = (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar10 < (ulong)((long)(bucket->
                                     super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar7 >>
                              3);
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar1);
  }
  pTVar3->pivot = uVar2;
  (pTVar3->buckets)._M_elems[0] = pvVar4;
  (pTVar3->buckets)._M_elems[1] = pvVar5;
  (pTVar3->buckets)._M_elems[2] = pvVar6;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"BurstSimple() pivot=",0x14);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," [0]=",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," [1]=",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," [2]=",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  return pTVar3;
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t /*depth*/) const
	{
		TSTNode<CharT>* new_node = new TSTNode<CharT>;
		BucketT* bucket0 = new BucketT;
		BucketT* bucket1 = new BucketT;
		BucketT* bucket2 = new BucketT;
		CharT pivot = pseudo_median(oracle, oracle+bucket.size());
		for (unsigned i=0; i < bucket.size(); ++i) {
			if (oracle[i] < pivot) {
				bucket0->push_back(bucket[i]);
			} else if (oracle[i] == pivot) {
				bucket1->push_back(bucket[i]);
			} else {
				bucket2->push_back(bucket[i]);
			}
		}
		new_node->pivot = pivot;
		new_node->buckets[0] = bucket0;
		new_node->buckets[1] = bucket1;
		new_node->buckets[2] = bucket2;
		debug() << "BurstSimple() pivot=" << pivot
			<< " [0]=" << bucket0->size()
			<< " [1]=" << bucket1->size()
			<< " [2]=" << bucket2->size()
			<< "\n";
		return new_node;
	}